

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O1

void __thiscall asl::HttpServer::HttpServer(HttpServer *this,int port)

{
  Dic<asl::String> *this_00;
  int *piVar1;
  KeyVal *pKVar2;
  undefined1 *puVar3;
  socklen_t in_ECX;
  sockaddr *__addr;
  String *sep1;
  undefined1 local_80 [32];
  undefined8 local_60;
  undefined2 local_58;
  undefined6 uStack_56;
  String local_48;
  
  SocketServer::SocketServer(&this->super_SocketServer);
  (this->super_SocketServer)._vptr_SocketServer = (_func_int **)&PTR_serve_00152950;
  (this->_webroot)._size = 0;
  (this->_webroot)._len = 0;
  (this->_webroot).field_2._space[0] = '\0';
  String::String(&this->_proto,"HTTP/1.1");
  this_00 = &this->_mimetypes;
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)this_00,0);
  String::String(&this->_methods,"GET, POST, OPTIONS, PUT, DELETE, PATCH, HEAD");
  (this->super_SocketServer)._requestStop = false;
  if (-1 < port) {
    SocketServer::bind(&this->super_SocketServer,port,__addr,in_ECX);
  }
  this->_wsserver = (WebSocketServer *)0x0;
  this->_cors = false;
  String::String((String *)(local_80 + 8),
                 "css:text/css,gif:image/gif,htm:text/html,html:text/html,jpeg:image/jpeg,jpg:image/jpeg,js:application/javascript,json:application/json,png:image/png,txt:text/plain,mp4:video/mp4,ogv:video/ogg,webm:video/webm,xml:text/xml"
                );
  local_48._size = 0;
  local_48._len = 1;
  local_48.field_2._0_2_ = 0x2c;
  local_60 = 0x100000000;
  local_58 = 0x3a;
  sep1 = (String *)(local_80 + 8);
  String::split((String *)local_80,sep1,&local_48);
  pKVar2 = (this_00->super_Map<asl::String,_asl::String>).a._a;
  if (pKVar2 != (KeyVal *)local_80._0_8_) {
    LOCK();
    puVar3 = (undefined1 *)((long)&pKVar2[-1].value.field_2 + 8);
    *(int *)puVar3 = *(int *)puVar3 + -1;
    UNLOCK();
    if (*(int *)puVar3 == 0) {
      Array<asl::Map<asl::String,_asl::String>::KeyVal>::free
                ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)this_00,sep1);
    }
    (this_00->super_Map<asl::String,_asl::String>).a._a = (KeyVal *)local_80._0_8_;
    LOCK();
    piVar1 = (int *)((long)&(((KeyVal *)(local_80._0_8_ + -0x30))->value).field_2 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::~Array
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)local_80);
  if ((int)local_60 != 0) {
    free((void *)CONCAT62(uStack_56,local_58));
  }
  if (local_48._size != 0) {
    free((void *)CONCAT62(local_48.field_2._2_6_,local_48.field_2._0_2_));
  }
  if (local_80._8_4_ != 0) {
    free((void *)local_80._16_8_);
  }
  return;
}

Assistant:

HttpServer::HttpServer(int port):
	_proto("HTTP/1.1"),
	_methods("GET, POST, OPTIONS, PUT, DELETE, PATCH, HEAD")
{
	_requestStop = false;
	if (port >= 0)
		bind(port);
	_wsserver = NULL;
	_cors = false;
	_mimetypes = String(
		"css:text/css,"
		"gif:image/gif,"
		"htm:text/html,"
		"html:text/html,"
		"jpeg:image/jpeg,"
		"jpg:image/jpeg,"
		"js:application/javascript,"
		"json:application/json,"
		"png:image/png,"
		"txt:text/plain,"
		"mp4:video/mp4,"
		"ogv:video/ogg,"
		"webm:video/webm,"
		"xml:text/xml"
		).split(',', ':');
}